

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O3

int Cbs2_ManUpdateFrontier(Cbs2_Man_t *p,int iPropHeadOld,int *piDecLit)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  size_t __size;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  timespec ts;
  timespec local_40;
  
  iVar5 = clock_gettime(3,&local_40);
  if (iVar5 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  iVar5 = (p->pJust).iTail;
  *piDecLit = -1;
  iVar6 = (p->pProp).iHead;
  if (iVar6 != (p->pProp).iTail) {
    __assert_fail("Cbs2_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                  ,0x4bb,"int Cbs2_ManUpdateFrontier(Cbs2_Man_t *, int, int *)");
  }
  iVar1 = (p->pJust).iHead;
  lVar12 = (long)iVar1;
  iVar10 = (p->pJust).iTail;
  if (iVar1 < iVar10) {
    piVar7 = (p->pJust).pData;
    do {
      uVar11 = piVar7[lVar12];
      if (((ulong)uVar11 == 0) || (iVar5 == lVar12)) break;
      if (((int)uVar11 < 0) || (p->pAig->nObjs <= (int)uVar11)) goto LAB_00725f1c;
      uVar3 = *(undefined8 *)(p->pAig->pObjs + uVar11);
      uVar9 = (uint)uVar3;
      if ((~uVar9 & 0x1fffffff) != 0 && -1 < (int)uVar9) {
        uVar9 = uVar11 - (uVar9 & 0x1fffffff);
        if (((int)uVar9 < 0) || (uVar2 = (p->vAssign).nSize, (int)uVar2 <= (int)uVar9))
        goto LAB_00725f3b;
        pcVar4 = (p->vAssign).pArray;
        if ('\x01' < pcVar4[uVar9]) {
          uVar9 = uVar11 - ((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff);
          if (((int)uVar9 < 0) || (uVar2 <= uVar9)) goto LAB_00725f3b;
          if ('\x01' < pcVar4[uVar9]) {
            if (iVar10 == (p->pJust).nSize) {
              (p->pJust).nSize = iVar10 * 2;
              __size = (long)(iVar10 * 2) << 2;
              if (piVar7 == (int *)0x0) {
                piVar7 = (int *)malloc(__size);
              }
              else {
                piVar7 = (int *)realloc(piVar7,__size);
                iVar10 = (p->pJust).iTail;
              }
              (p->pJust).pData = piVar7;
            }
            (p->pJust).iTail = iVar10 + 1;
            piVar7[iVar10] = uVar11;
            iVar10 = (p->pJust).iTail;
          }
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar10);
    iVar6 = (p->pProp).iTail;
  }
  (p->pProp).iHead = iPropHeadOld;
  if (iPropHeadOld < iVar6) {
    lVar12 = (long)iPropHeadOld;
    do {
      uVar11 = (p->pProp).pData[lVar12];
      if (uVar11 == 0) break;
      if ((int)uVar11 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar11 = uVar11 >> 1;
      if (p->pAig->nObjs <= (int)uVar11) {
LAB_00725f1c:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar3 = *(undefined8 *)(p->pAig->pObjs + uVar11);
      uVar9 = (uint)uVar3;
      if ((~uVar9 & 0x1fffffff) != 0 && -1 < (int)uVar9) {
        uVar9 = uVar11 - (uVar9 & 0x1fffffff);
        if (((int)uVar9 < 0) || (uVar2 = (p->vAssign).nSize, (int)uVar2 <= (int)uVar9))
        goto LAB_00725f3b;
        pcVar4 = (p->vAssign).pArray;
        if ('\x01' < pcVar4[uVar9]) {
          uVar9 = uVar11 - ((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff);
          if (((int)uVar9 < 0) || (uVar2 <= uVar9)) {
LAB_00725f3b:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          if ('\x01' < pcVar4[uVar9]) {
            iVar6 = (p->pJust).iTail;
            if (iVar6 == (p->pJust).nSize) {
              (p->pJust).nSize = iVar6 * 2;
              piVar7 = (p->pJust).pData;
              if (piVar7 == (int *)0x0) {
                piVar7 = (int *)malloc((long)iVar6 << 3);
              }
              else {
                piVar7 = (int *)realloc(piVar7,(long)iVar6 << 3);
                iVar6 = (p->pJust).iTail;
              }
              (p->pJust).pData = piVar7;
            }
            else {
              piVar7 = (p->pJust).pData;
            }
            (p->pJust).iTail = iVar6 + 1;
            piVar7[iVar6] = uVar11;
            iVar6 = (p->pProp).iTail;
          }
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar6);
  }
  (p->pProp).iHead = iVar6;
  (p->pJust).iHead = iVar5;
  iVar5 = clock_gettime(3,&local_40);
  if (iVar5 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeJFront = p->timeJFront + lVar12 + lVar8;
  return (int)((p->pJust).iHead == (p->pJust).iTail);
}

Assistant:

int Cbs2_ManUpdateFrontier( Cbs2_Man_t * p, int iPropHeadOld, int * piDecLit )
{
    abctime clk = Abc_Clock();
    int i, iVar, iLit, iJustTailOld = p->pJust.iTail;
    *piDecLit = -1;
    assert( Cbs2_QueIsEmpty(&p->pProp) );
    // visit old frontier nodes
    Cbs2_QueForEachEntry( p->pJust, iVar, i )
        if ( i == iJustTailOld )
            break;
        else if ( Cbs2_VarIsJust(p, Gia_ManObj(p->pAig, iVar), iVar) )
        {
            Cbs2_QuePush( &p->pJust, iVar );
            //*piDecLit = Cbs2_ManUpdateDecVar( p, iVar, *piDecLit );
        }
    // append new nodes
    p->pProp.iHead = iPropHeadOld;
    Cbs2_QueForEachEntry( p->pProp, iLit, i )
    {
        iVar = Abc_Lit2Var(iLit);
        if ( Cbs2_VarIsJust(p, Gia_ManObj(p->pAig, iVar), iVar) )
        {
            Cbs2_QuePush( &p->pJust, iVar );
            //*piDecLit = Cbs2_ManUpdateDecVar( p, iVar, *piDecLit );
        }
    }
    p->pProp.iHead = p->pProp.iTail;
    // update the head of the frontier
    p->pJust.iHead = iJustTailOld;
    // return 1 if the queue is empty
    p->timeJFront += Abc_Clock() - clk;
//printf( "%d ", p->pJust.iTail - p->pJust.iHead );
    return Cbs2_QueIsEmpty(&p->pJust);
}